

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_int,std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  long *plVar4;
  idx_t size;
  Vector *pVVar5;
  idx_t iVar6;
  long lVar7;
  idx_t iVar8;
  undefined8 *puVar9;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(state_vector,count,&local_68);
  size = ListVector::GetListSize(result);
  if (count == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    iVar6 = 0;
    do {
      iVar8 = iVar6;
      if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)(local_68.sel)->sel_vector[iVar6];
      }
      if (**(long **)(local_68.data + iVar8 * 8) != 0) {
        lVar7 = lVar7 + *(long *)(**(long **)(local_68.data + iVar8 * 8) + 0x18);
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  ListVector::Reserve(result,lVar7 + size);
  pVVar5 = ListVector::GetEntry(result);
  if (count != 0) {
    pdVar1 = result->data;
    psVar2 = (local_68.sel)->sel_vector;
    pdVar3 = pVVar5->data;
    iVar6 = 0;
    do {
      iVar8 = iVar6;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar6];
      }
      plVar4 = *(long **)(local_68.data + iVar8 * 8);
      *(idx_t *)(pdVar1 + iVar6 * 0x10) = size;
      if (*plVar4 == 0) {
        lVar7 = 0;
      }
      else {
        iVar8 = size;
        for (puVar9 = *(undefined8 **)(*plVar4 + 0x10); puVar9 != (undefined8 *)0x0;
            puVar9 = (undefined8 *)*puVar9) {
          *(undefined4 *)(pdVar3 + iVar8 * 4) = *(undefined4 *)(puVar9 + 1);
          iVar8 = iVar8 + 1;
        }
        lVar7 = iVar8 - size;
        size = iVar8;
      }
      *(long *)(pdVar1 + iVar6 * 0x10 + 8) = lVar7;
      iVar6 = iVar6 + 1;
    } while (iVar6 != count);
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  if (local_68.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}